

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t ucase_getCaseLocale_63(char *locale)

{
  char cVar1;
  char *pcVar2;
  char local_19;
  char *pcStack_18;
  char c;
  char *locale_local;
  
  pcVar2 = locale + 1;
  cVar1 = *locale;
  if (cVar1 == 'e') {
    if ((*pcVar2 == 'l') || (*pcVar2 == 'L')) {
      local_19 = locale[2];
      if ((local_19 == 'l') || (local_19 == 'L')) {
        local_19 = locale[3];
      }
      if (((local_19 == '_') || (local_19 == '-')) || (local_19 == '\0')) {
        return 4;
      }
    }
  }
  else {
    if (cVar1 == 'z') {
      return 1;
    }
    if (cVar1 < 'a') {
      if (cVar1 == 'T') {
        local_19 = *pcVar2;
        if ((local_19 == 'u') || (pcStack_18 = locale + 2, local_19 == 'U')) {
          pcStack_18 = locale + 3;
          local_19 = locale[2];
        }
        if (((local_19 == 'r') || (local_19 == 'R')) &&
           ((cVar1 = *pcStack_18, cVar1 == '_' || ((cVar1 == '-' || (cVar1 == '\0')))))) {
          return 2;
        }
      }
      else if (cVar1 == 'A') {
        if ((*pcVar2 == 'z') || (*pcVar2 == 'Z')) {
          local_19 = locale[2];
          if ((local_19 == 'e') || (local_19 == 'E')) {
            local_19 = locale[3];
          }
          if (((local_19 == '_') || (local_19 == '-')) || (local_19 == '\0')) {
            return 2;
          }
        }
      }
      else if (cVar1 == 'L') {
        local_19 = *pcVar2;
        if ((local_19 == 'i') || (pcStack_18 = locale + 2, local_19 == 'I')) {
          pcStack_18 = locale + 3;
          local_19 = locale[2];
        }
        if (((local_19 == 't') || (local_19 == 'T')) &&
           ((cVar1 = *pcStack_18, cVar1 == '_' || ((cVar1 == '-' || (cVar1 == '\0')))))) {
          return 3;
        }
      }
      else if (cVar1 == 'E') {
        if ((*pcVar2 == 'l') || (*pcVar2 == 'L')) {
          local_19 = locale[2];
          if ((local_19 == 'l') || (local_19 == 'L')) {
            local_19 = locale[3];
          }
          if (((local_19 == '_') || (local_19 == '-')) || (local_19 == '\0')) {
            return 4;
          }
        }
      }
      else if (cVar1 == 'N') {
        if ((*pcVar2 == 'l') || (*pcVar2 == 'L')) {
          local_19 = locale[2];
          if ((local_19 == 'd') || (local_19 == 'D')) {
            local_19 = locale[3];
          }
          if (((local_19 == '_') || (local_19 == '-')) || (local_19 == '\0')) {
            return 5;
          }
        }
      }
    }
    else if (cVar1 == 't') {
      local_19 = *pcVar2;
      if ((local_19 == 'u') || (pcStack_18 = locale + 2, local_19 == 'U')) {
        pcStack_18 = locale + 3;
        local_19 = locale[2];
      }
      if (((local_19 == 'r') || (local_19 == 'R')) &&
         ((cVar1 = *pcStack_18, cVar1 == '_' || ((cVar1 == '-' || (cVar1 == '\0')))))) {
        return 2;
      }
    }
    else if (cVar1 == 'a') {
      if ((*pcVar2 == 'z') || (*pcVar2 == 'Z')) {
        local_19 = locale[2];
        if ((local_19 == 'e') || (local_19 == 'E')) {
          local_19 = locale[3];
        }
        if (((local_19 == '_') || (local_19 == '-')) || (local_19 == '\0')) {
          return 2;
        }
      }
    }
    else if (cVar1 == 'l') {
      local_19 = *pcVar2;
      if ((local_19 == 'i') || (pcStack_18 = locale + 2, local_19 == 'I')) {
        pcStack_18 = locale + 3;
        local_19 = locale[2];
      }
      if (((local_19 == 't') || (local_19 == 'T')) &&
         ((cVar1 = *pcStack_18, cVar1 == '_' || ((cVar1 == '-' || (cVar1 == '\0')))))) {
        return 3;
      }
    }
    else if (cVar1 == 'n') {
      if ((*pcVar2 == 'l') || (*pcVar2 == 'L')) {
        local_19 = locale[2];
        if ((local_19 == 'd') || (local_19 == 'D')) {
          local_19 = locale[3];
        }
        if (((local_19 == '_') || (local_19 == '-')) || (local_19 == '\0')) {
          return 5;
        }
      }
    }
  }
  return 1;
}

Assistant:

U_CFUNC int32_t
ucase_getCaseLocale(const char *locale) {
    /*
     * This function used to use uloc_getLanguage(), but the current code
     * removes the dependency of this low-level code on uloc implementation code
     * and is faster because not the whole locale ID has to be
     * examined and copied/transformed.
     *
     * Because this code does not want to depend on uloc, the caller must
     * pass in a non-NULL locale, i.e., may need to call uloc_getDefault().
     */
    char c=*locale++;
    // Fastpath for English "en" which is often used for default (=root locale) case mappings,
    // and for Chinese "zh": Very common but no special case mapping behavior.
    // Then check lowercase vs. uppercase to reduce the number of comparisons
    // for other locales without special behavior.
    if(c=='e') {
        /* el or ell? */
        c=*locale++;
        if(is_l(c)) {
            c=*locale++;
            if(is_l(c)) {
                c=*locale;
            }
            if(is_sep(c)) {
                return UCASE_LOC_GREEK;
            }
        }
        // en, es, ... -> root
    } else if(c=='z') {
        return UCASE_LOC_ROOT;
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
    } else if(c>='a') {  // ASCII a-z = 0x61..0x7a, after A-Z
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
    } else if(c<='z') {  // EBCDIC a-z = 0x81..0xa9 with two gaps, before A-Z
#else
#   error Unknown charset family!
#endif
        // lowercase c
        if(c=='t') {
            /* tr or tur? */
            c=*locale++;
            if(is_u(c)) {
                c=*locale++;
            }
            if(is_r(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='a') {
            /* az or aze? */
            c=*locale++;
            if(is_z(c)) {
                c=*locale++;
                if(is_e(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='l') {
            /* lt or lit? */
            c=*locale++;
            if(is_i(c)) {
                c=*locale++;
            }
            if(is_t(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_LITHUANIAN;
                }
            }
        } else if(c=='n') {
            /* nl or nld? */
            c=*locale++;
            if(is_l(c)) {
                c=*locale++;
                if(is_d(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_DUTCH;
                }
            }
        }
    } else {
        // uppercase c
        // Same code as for lowercase c but also check for 'E'.
        if(c=='T') {
            /* tr or tur? */
            c=*locale++;
            if(is_u(c)) {
                c=*locale++;
            }
            if(is_r(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='A') {
            /* az or aze? */
            c=*locale++;
            if(is_z(c)) {
                c=*locale++;
                if(is_e(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='L') {
            /* lt or lit? */
            c=*locale++;
            if(is_i(c)) {
                c=*locale++;
            }
            if(is_t(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_LITHUANIAN;
                }
            }
        } else if(c=='E') {
            /* el or ell? */
            c=*locale++;
            if(is_l(c)) {
                c=*locale++;
                if(is_l(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_GREEK;
                }
            }
        } else if(c=='N') {
            /* nl or nld? */
            c=*locale++;
            if(is_l(c)) {
                c=*locale++;
                if(is_d(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_DUTCH;
                }
            }
        }
    }
    return UCASE_LOC_ROOT;
}